

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

bool absl::anon_unknown_0::HandleEdgeCase<double>
               (ParsedFloat *input,bool negative,Nonnull<double_*> value)

{
  byte bVar1;
  long *plVar2;
  double *in_RDX;
  byte in_SIL;
  long *in_RDI;
  double dVar3;
  double dVar4;
  char *nan_argument;
  ptrdiff_t nan_size;
  char n_char_sequence [128];
  ptrdiff_t kNanBufferSize;
  double local_f0;
  char *in_stack_ffffffffffffff28;
  long in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  long local_b8;
  long local_b0;
  undefined1 local_a8 [128];
  undefined8 local_28;
  double *local_20;
  byte local_11;
  bool local_1;
  
  bVar1 = in_SIL & 1;
  local_20 = in_RDX;
  local_11 = bVar1;
  if ((int)in_RDI[2] == 2) {
    local_28 = 0x80;
    if (in_RDI[3] == 0) {
      local_a8[0] = 0;
    }
    else {
      local_b0 = in_RDI[4] - in_RDI[3];
      local_b8 = 0x7f;
      plVar2 = std::min<long>(&local_b0,&local_b8);
      local_b0 = *plVar2;
      std::copy_n<char_const*,long,char*>
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      local_a8[local_b0] = 0;
    }
    if ((local_11 & 1) == 0) {
      dVar3 = FloatTraits<double>::MakeNan((Nonnull<const_char_*>)0x3a81b3);
    }
    else {
      dVar3 = FloatTraits<double>::MakeNan((Nonnull<const_char_*>)0x3a818a);
      dVar3 = -dVar3;
    }
    *local_20 = dVar3;
    local_1 = true;
  }
  else if ((int)in_RDI[2] == 1) {
    dVar3 = std::numeric_limits<double>::infinity();
    dVar4 = std::numeric_limits<double>::infinity();
    dVar3 = -dVar3;
    if (bVar1 == 0) {
      dVar3 = dVar4;
    }
    *local_20 = dVar3;
    local_1 = true;
  }
  else if (*in_RDI == 0) {
    local_f0 = -0.0;
    if (bVar1 == 0) {
      local_f0 = 0.0;
    }
    *in_RDX = local_f0;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HandleEdgeCase(const strings_internal::ParsedFloat& input, bool negative,
                    absl::Nonnull<FloatType*> value) {
  if (input.type == strings_internal::FloatType::kNan) {
    // A bug in both clang < 7 and gcc would cause the compiler to optimize
    // away the buffer we are building below.  Declaring the buffer volatile
    // avoids the issue, and has no measurable performance impact in
    // microbenchmarks.
    //
    // https://bugs.llvm.org/show_bug.cgi?id=37778
    // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=86113
    constexpr ptrdiff_t kNanBufferSize = 128;
#if (defined(__GNUC__) && !defined(__clang__)) || \
    (defined(__clang__) && __clang_major__ < 7)
    volatile char n_char_sequence[kNanBufferSize];
#else
    char n_char_sequence[kNanBufferSize];
#endif
    if (input.subrange_begin == nullptr) {
      n_char_sequence[0] = '\0';
    } else {
      ptrdiff_t nan_size = input.subrange_end - input.subrange_begin;
      nan_size = std::min(nan_size, kNanBufferSize - 1);
      std::copy_n(input.subrange_begin, nan_size, n_char_sequence);
      n_char_sequence[nan_size] = '\0';
    }
    char* nan_argument = const_cast<char*>(n_char_sequence);
    *value = negative ? -FloatTraits<FloatType>::MakeNan(nan_argument)
                      : FloatTraits<FloatType>::MakeNan(nan_argument);
    return true;
  }
  if (input.type == strings_internal::FloatType::kInfinity) {
    *value = negative ? -std::numeric_limits<FloatType>::infinity()
                      : std::numeric_limits<FloatType>::infinity();
    return true;
  }
  if (input.mantissa == 0) {
    *value = negative ? -0.0 : 0.0;
    return true;
  }
  return false;
}